

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O3

void __thiscall pbrt::BufferCache<int>::Clear(BufferCache<int> *this)

{
  mutex *__mutex;
  memory_resource *pmVar1;
  int iVar2;
  undefined8 uVar3;
  _Hash_node_base *p_Var4;
  
  __mutex = &this->mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    for (p_Var4 = (this->cache)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
        p_Var4 = p_Var4->_M_nxt) {
      if (p_Var4[1]._M_nxt != (_Hash_node_base *)0x0) {
        pmVar1 = (this->alloc).memoryResource;
        (*pmVar1->_vptr_memory_resource[3])(pmVar1,p_Var4[1]._M_nxt,(long)p_Var4[2]._M_nxt << 2,4);
      }
    }
    std::
    _Hashtable<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::Buffer,_std::allocator<pbrt::BufferCache<int>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_pbrt::BufferCache<int>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->cache)._M_h);
    this->bytesUsed = 0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void Clear() {
        std::lock_guard<std::mutex> lock(mutex);
        for (auto iter : cache)
            alloc.deallocate_object(const_cast<T *>(iter.ptr), iter.size);
        cache.clear();
        bytesUsed = 0;
    }